

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::readArrayBasedContainer<QList<int>>(QDataStream *s,QList<int> *c)

{
  Status SVar1;
  undefined1 *asize;
  long in_FS_OFFSET;
  quint32 first;
  undefined1 *local_58;
  uint local_4c;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<int>::clear(c);
  local_4c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(qint32 *)&local_4c);
  asize = (undefined1 *)(ulong)local_4c;
  if (asize == (undefined1 *)0xfffffffe) {
    if (0x15 < s->ver) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::operator>>(s,(qint64 *)&local_58);
      asize = local_58;
      if ((long)local_58 < 0) goto LAB_0038bd78;
    }
  }
  else if (local_4c == 0xffffffff) {
LAB_0038bd78:
    QDataStream::setStatus(s,SizeLimitExceeded);
    goto LAB_0038be15;
  }
  QList<int>::reserve(c,(qsizetype)asize);
  if (asize != (undefined1 *)0x0) {
    do {
      local_4c = 0xaaaaaaaa;
      QDataStream::operator>>(s,(qint32 *)&local_4c);
      SVar1 = QDataStream::status(s);
      if (SVar1 != Ok) {
        QList<int>::clear(c);
        break;
      }
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,local_4c);
      QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)c,(c->d).size,(int *)&local_58);
      QList<int>::end(c);
      asize = asize + -1;
    } while (asize != (undefined1 *)0x0);
  }
LAB_0038be15:
  if (local_48._8_4_ != Ok) {
    QDataStream::resetStatus((QDataStream *)local_48._0_8_);
    QDataStream::setStatus((QDataStream *)local_48._0_8_,local_48._8_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}